

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O0

Abc_IffMan_t * Abc_NtkIfifStart(Abc_Ntk_t *pNtk,Ifif_Par_t *pPars)

{
  int iVar1;
  Abc_IffMan_t *pAVar2;
  Abc_IffObj_t *pAVar3;
  Abc_IffMan_t *p;
  Ifif_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar2 = (Abc_IffMan_t *)calloc(1,0x20);
  pAVar2->pNtk = pNtk;
  pAVar2->pPars = pPars;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pAVar2->nObjs = iVar1;
  pAVar3 = (Abc_IffObj_t *)calloc((long)pAVar2->nObjs,0x1c);
  pAVar2->pObjs = pAVar3;
  return pAVar2;
}

Assistant:

Abc_IffMan_t * Abc_NtkIfifStart( Abc_Ntk_t * pNtk, Ifif_Par_t * pPars )
{
    Abc_IffMan_t * p;
    p = ABC_CALLOC( Abc_IffMan_t, 1 );
    p->pNtk       = pNtk;
    p->pPars      = pPars;
    // internal data
    p->nObjs      = Abc_NtkObjNumMax( pNtk );
    p->pObjs      = ABC_CALLOC( Abc_IffObj_t, p->nObjs );
    return p;
}